

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_lyb.c
# Opt level: O0

LY_ERR lyb_print_term_value(lyd_node_term *term,ly_out *out,lylyb_ctx *lybctx)

{
  int iVar1;
  lyplg_type_print_clb p_Var2;
  lyplg_type_print_clb print;
  size_t sStack_38;
  int32_t lyb_data_len;
  size_t value_len;
  void *value;
  ly_bool dynamic;
  lylyb_ctx *plStack_20;
  LY_ERR ret;
  lylyb_ctx *lybctx_local;
  ly_out *out_local;
  lyd_node_term *term_local;
  
  value._4_4_ = LY_SUCCESS;
  value._3_1_ = '\0';
  sStack_38 = 0;
  plStack_20 = lybctx;
  lybctx_local = (lylyb_ctx *)out;
  out_local = (ly_out *)term;
  if (((((term->value).realtype == (lysc_type *)0x0) ||
       (((term->value).realtype)->plugin == (lyplg_type *)0x0)) ||
      (((term->value).realtype)->plugin->print == (lyplg_type_print_clb)0x0)) ||
     ((term->field_0).node.schema == (lysc_node *)0x0)) {
    __assert_fail("term->value.realtype && term->value.realtype->plugin && term->value.realtype->plugin->print && term->schema"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/printer_lyb.c"
                  ,0x2b8,
                  "LY_ERR lyb_print_term_value(struct lyd_node_term *, struct ly_out *, struct lylyb_ctx *)"
                 );
  }
  iVar1 = ((term->value).realtype)->plugin->lyb_data_len;
  p_Var2 = ((term->value).realtype)->plugin->print;
  if (iVar1 < 0) {
    value_len = (size_t)(*p_Var2)(((term->field_0).node.schema)->module->ctx,&term->value,
                                  LY_VALUE_LYB,(void *)0x0,(ly_bool *)((long)&value + 3),
                                  &stack0xffffffffffffffc8);
    if (value._4_4_ != LY_SUCCESS) goto LAB_00160444;
    if (0xffffffff < sStack_38) {
      ly_log(plStack_20->ctx,LY_LLERR,LY_EINT,
             "The maximum length of the LYB data from a term node must not exceed %u.",0xffffffff);
      value._4_4_ = LY_EINT;
      goto LAB_00160444;
    }
    value._4_4_ = lyb_write_number(sStack_38,8,(ly_out *)lybctx_local,plStack_20);
    if (value._4_4_ != LY_SUCCESS) goto LAB_00160444;
  }
  else {
    value_len = (size_t)(*p_Var2)(((term->field_0).node.schema)->module->ctx,&term->value,
                                  LY_VALUE_LYB,(void *)0x0,(ly_bool *)((long)&value + 3),
                                  (size_t *)0x0);
    if (value._4_4_ != LY_SUCCESS) goto LAB_00160444;
    sStack_38 = (size_t)iVar1;
  }
  if (sStack_38 != 0) {
    value._4_4_ = lyb_write((ly_out *)lybctx_local,(uint8_t *)value_len,sStack_38,plStack_20);
  }
LAB_00160444:
  if (value._3_1_ != '\0') {
    free((void *)value_len);
  }
  return value._4_4_;
}

Assistant:

static LY_ERR
lyb_print_term_value(struct lyd_node_term *term, struct ly_out *out, struct lylyb_ctx *lybctx)
{
    LY_ERR ret = LY_SUCCESS;
    ly_bool dynamic = 0;
    void *value;
    size_t value_len = 0;
    int32_t lyb_data_len;
    lyplg_type_print_clb print;

    assert(term->value.realtype && term->value.realtype->plugin && term->value.realtype->plugin->print &&
            term->schema);

    /* Get length of LYB data to print. */
    lyb_data_len = term->value.realtype->plugin->lyb_data_len;

    /* Get value and also print its length only if size is not fixed. */
    print = term->value.realtype->plugin->print;
    if (lyb_data_len < 0) {
        /* Variable-length data. */

        /* Get value and its length from plugin. */
        value = (void *)print(term->schema->module->ctx, &term->value,
                LY_VALUE_LYB, NULL, &dynamic, &value_len);
        LY_CHECK_GOTO(ret, cleanup);

        if (value_len > UINT32_MAX) {
            LOGERR(lybctx->ctx, LY_EINT, "The maximum length of the LYB data "
                    "from a term node must not exceed %" PRIu32 ".", UINT32_MAX);
            ret = LY_EINT;
            goto cleanup;
        }

        /* Print the length of the data as 64-bit unsigned integer. */
        ret = lyb_write_number(value_len, sizeof(uint64_t), out, lybctx);
        LY_CHECK_GOTO(ret, cleanup);
    } else {
        /* Fixed-length data. */

        /* Get value from plugin. */
        value = (void *)print(term->schema->module->ctx, &term->value,
                LY_VALUE_LYB, NULL, &dynamic, NULL);
        LY_CHECK_GOTO(ret, cleanup);

        /* Copy the length from the compiled node. */
        value_len = lyb_data_len;
    }

    /* Print value. */
    if (value_len > 0) {
        /* Print the value simply as it is. */
        ret = lyb_write(out, value, value_len, lybctx);
        LY_CHECK_GOTO(ret, cleanup);
    }

cleanup:
    if (dynamic) {
        free(value);
    }

    return ret;
}